

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

PsbtSignatureDataStruct * __thiscall
cfd::api::json::PsbtSignatureData::ConvertToStruct
          (PsbtSignatureDataStruct *__return_storage_ptr__,PsbtSignatureData *this)

{
  PsbtSignatureDataStruct::PsbtSignatureDataStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->signature);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PsbtSignatureDataStruct PsbtSignatureData::ConvertToStruct() const {  // NOLINT
  PsbtSignatureDataStruct result;
  result.pubkey = pubkey_;
  result.signature = signature_;
  result.ignore_items = ignore_items;
  return result;
}